

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O2

unsigned_long llvm::reverseBits<unsigned_long>(unsigned_long Val)

{
  byte *pbVar1;
  uchar auVar2 [8];
  long lVar3;
  uchar uStack_11;
  uchar out [8];
  uchar in [8];
  
  pbVar1 = in;
  in = (uchar  [8])Val;
  lVar3 = 8;
  while (lVar3 != 0) {
    out[lVar3 + -1] = BitReverseTable256[*pbVar1];
    pbVar1 = pbVar1 + 1;
    lVar3 = lVar3 + -1;
  }
  auVar2[0] = out[0];
  auVar2[1] = out[1];
  auVar2[2] = out[2];
  auVar2[3] = out[3];
  auVar2[4] = out[4];
  auVar2[5] = out[5];
  auVar2[6] = out[6];
  auVar2[7] = out[7];
  return (unsigned_long)auVar2;
}

Assistant:

T reverseBits(T Val) {
  unsigned char in[sizeof(Val)];
  unsigned char out[sizeof(Val)];
  std::memcpy(in, &Val, sizeof(Val));
  for (unsigned i = 0; i < sizeof(Val); ++i)
    out[(sizeof(Val) - i) - 1] = BitReverseTable256[in[i]];
  std::memcpy(&Val, out, sizeof(Val));
  return Val;
}